

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainfo.c
# Opt level: O3

int ndn_metainfo_tlv_encode(ndn_encoder_t *encoder,ndn_metainfo_t *meta)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t length;
  uint32_t length_00;
  
  uVar2 = (uint)(meta->enable_ContentType != '\0') * 3;
  if (meta->enable_FreshnessPeriod != '\0') {
    uVar1 = meta->freshness_period;
    iVar3 = 3;
    if ((0xff < uVar1) && (iVar3 = 4, 0xffff < uVar1)) {
      iVar3 = (uint)(uVar1 >> 0x20 != 0) * 4 + 6;
    }
    uVar2 = uVar2 + iVar3;
  }
  if (meta->enable_FinalBlockId == '\0') {
    length_00 = 0;
    if (uVar2 == 0) {
      return 0;
    }
  }
  else {
    uVar5 = (meta->final_block_id).type;
    uVar4 = (uint)(meta->final_block_id).size;
    iVar3 = 1;
    if (0xfc < uVar5) {
      iVar3 = (0xffff < uVar5) + 3 + (uint)(0xffff < uVar5);
    }
    length_00 = iVar3 + uVar4 + (uint)(0xfc < uVar4) * 2 + 1;
    uVar2 = iVar3 + uVar4 + (uint)(0xfc < uVar4) * 2 + uVar2 + (uint)(0xfc < length_00) * 2 + 3;
  }
  uVar5 = encoder->offset;
  if (encoder->output_max_size < uVar5 + uVar2 + (uint)(0xfc < uVar2) * 2 + 2) {
    return -10;
  }
  if (encoder->output_max_size == uVar5) {
    return -0xe;
  }
  encoder->output_value[uVar5] = '\x14';
  uVar5 = encoder->offset + 1;
  encoder->offset = uVar5;
  iVar3 = 1;
  if (0xfc < uVar2 || encoder->output_max_size == uVar5) {
    if (encoder->output_max_size - uVar5 < 3) {
      return -0xe;
    }
    encoder->output_value[uVar5] = 0xfd;
    encoder->output_value[encoder->offset + 1] = (uint8_t)(uVar2 >> 8);
    uVar5 = encoder->offset + 2;
    iVar3 = 3;
  }
  encoder->output_value[uVar5] = (uint8_t)uVar2;
  uVar2 = iVar3 + encoder->offset;
  encoder->offset = uVar2;
  if (meta->enable_ContentType != '\0') {
    if (encoder->output_max_size == uVar2) {
      return -0xe;
    }
    encoder->output_value[uVar2] = '\x18';
    encoder->offset = encoder->offset + 1;
    iVar3 = encoder_append_length(encoder,1);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (encoder->output_max_size < encoder->offset + 1) {
      return -10;
    }
    encoder->output_value[encoder->offset] = meta->content_type;
    encoder->offset = encoder->offset + 1;
  }
  if (meta->enable_FreshnessPeriod != '\0') {
    iVar3 = encoder_append_type(encoder,0x19);
    if (iVar3 != 0) {
      return iVar3;
    }
    uVar1 = meta->freshness_period;
    length = 1;
    if ((0xff < uVar1) && (length = 2, 0xffff < uVar1)) {
      length = (uint)(uVar1 >> 0x20 != 0) * 4 + 4;
    }
    iVar3 = encoder_append_length(encoder,length);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = encoder_append_uint_value(encoder,meta->freshness_period);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  if (meta->enable_FinalBlockId != '\0') {
    iVar3 = encoder_append_type(encoder,0x1a);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = encoder_append_length(encoder,length_00);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = name_component_tlv_encode(encoder,&meta->final_block_id);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int
ndn_metainfo_tlv_encode(ndn_encoder_t* encoder, const ndn_metainfo_t* meta)
{

  int ret_val = -1;
  
  uint32_t meta_value_size = 0;
  uint32_t comp_tlv_size = 0;
  if (meta->enable_ContentType) {
    meta_value_size += encoder_probe_block_size(TLV_ContentType, 1);
  }
  if (meta->enable_FreshnessPeriod) {
    meta_value_size += encoder_probe_block_size(TLV_FreshnessPeriod, 
                                                encoder_probe_uint_length(meta->freshness_period));
  }
  if (meta->enable_FinalBlockId) {
    comp_tlv_size = name_component_probe_block_size(&meta->final_block_id);
    meta_value_size += encoder_probe_block_size(TLV_FinalBlockId, comp_tlv_size);
  }

  if (meta_value_size == 0)
    return 0;

  if (encoder->offset + encoder_probe_block_size(TLV_MetaInfo, meta_value_size)
      > encoder->output_max_size)
    return NDN_OVERSIZE;

  ret_val = encoder_append_type(encoder, TLV_MetaInfo);
  if (ret_val != NDN_SUCCESS) return ret_val;
  ret_val = encoder_append_length(encoder, meta_value_size);
  if (ret_val != NDN_SUCCESS) return ret_val;

  if (meta->enable_ContentType) {
    ret_val = encoder_append_type(encoder, TLV_ContentType);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, 1);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_byte_value(encoder, meta->content_type);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FreshnessPeriod) {
    ret_val = encoder_append_type(encoder, TLV_FreshnessPeriod);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, encoder_probe_uint_length(meta->freshness_period));
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_uint_value(encoder, meta->freshness_period);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  if (meta->enable_FinalBlockId) {
    ret_val = encoder_append_type(encoder, TLV_FinalBlockId);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(encoder, comp_tlv_size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = name_component_tlv_encode(encoder, &meta->final_block_id);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  return 0;
}